

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

MPP_RET fill_image(RK_U8 *buf,RK_U32 width,RK_U32 height,RK_U32 hor_stride,RK_U32 ver_stride,
                  MppFrameFormat fmt,RK_U32 frame_count)

{
  char cVar1;
  char cVar2;
  MppFrameFormat MVar3;
  RK_S32 RVar4;
  RK_U32 local_114;
  RK_U32 local_110;
  RK_U32 B_2;
  RK_U32 G_2;
  RK_U32 R_2;
  FillRgbFunc fill_2;
  RK_U8 *pRStack_f8;
  RK_U32 pix_w_2;
  RK_U8 *p_13;
  RK_U32 local_e8;
  RK_U32 B_1;
  RK_U32 G_1;
  RK_U32 R_1;
  FillRgbFunc fill_1;
  RK_U8 *pRStack_d0;
  RK_U32 pix_w_1;
  RK_U8 *p_12;
  RK_U32 local_c0;
  RK_U32 B;
  RK_U32 G;
  RK_U32 R;
  FillRgbFunc fill;
  RK_U8 *pRStack_a8;
  RK_U32 pix_w;
  RK_U8 *p_11;
  RK_U8 *p_10;
  RK_U8 *p_9;
  RK_U8 *p_8;
  RK_U8 *p_7;
  RK_U8 *p_6;
  RK_U8 *p_5;
  RK_U8 *p_4;
  RK_U8 *p_3;
  RK_U8 *p_2;
  RK_U8 *p_1;
  RK_U8 *p;
  uint local_40;
  RK_U32 i;
  RK_U32 y;
  RK_U32 x;
  RK_U8 *buf_c;
  RK_U8 *buf_y;
  MPP_RET ret;
  MppFrameFormat fmt_local;
  RK_U32 ver_stride_local;
  RK_U32 hor_stride_local;
  RK_U32 height_local;
  RK_U32 width_local;
  RK_U8 *buf_local;
  
  buf_y._0_4_ = MPP_OK;
  _y = buf + hor_stride * ver_stride;
  MVar3 = fmt & 0xfffff;
  buf_c = buf;
  buf_y._4_4_ = fmt;
  ret = ver_stride;
  fmt_local = hor_stride;
  ver_stride_local = height;
  hor_stride_local = width;
  _height_local = buf;
  if (MVar3 == MPP_FMT_YUV420SP) {
    fill_MPP_FMT_YUV420SP(buf,width,height,hor_stride,ver_stride,frame_count);
  }
  else if (MVar3 == MPP_FMT_YUV422SP) {
    fill_MPP_FMT_YUV422SP(buf,width,height,hor_stride,ver_stride,frame_count);
  }
  else {
    cVar2 = (char)frame_count;
    if (MVar3 == MPP_FMT_YUV420P) {
      p_1 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_1[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_1 = p_1 + hor_stride;
      }
      p_1 = _y;
      for (local_40 = 0; local_40 < height >> 1; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_1[i] = (char)local_40 + -0x80 + (char)(frame_count << 1);
        }
        p_1 = p_1 + (hor_stride >> 1);
      }
      p_1 = _y + (hor_stride * ver_stride >> 2);
      for (local_40 = 0; local_40 < height >> 1; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_1[i] = (char)i + '@' + cVar2 * '\x05';
        }
        p_1 = p_1 + (hor_stride >> 1);
      }
    }
    else if (MVar3 == MPP_FMT_YUV420SP_VU) {
      p_2 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_2[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_2 = p_2 + hor_stride;
      }
      p_2 = _y;
      for (local_40 = 0; local_40 < height >> 1; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_2[i * 2 + 1] = (char)local_40 + -0x80 + (char)(frame_count << 1);
          p_2[i << 1] = (char)i + '@' + cVar2 * '\x05';
        }
        p_2 = p_2 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV422P) {
      p_3 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_3[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_3 = p_3 + hor_stride;
      }
      p_3 = _y;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_3[i] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
        }
        p_3 = p_3 + (hor_stride >> 1);
      }
      p_3 = _y + (hor_stride * ver_stride >> 1);
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_3[i] = (char)i + '@' + cVar2 * '\x05';
        }
        p_3 = p_3 + (hor_stride >> 1);
      }
    }
    else if (MVar3 == MPP_FMT_YUV422SP_VU) {
      p_4 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_4[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_4 = p_4 + hor_stride;
      }
      p_4 = _y;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          p_4[i * 2 + 1] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_4[i << 1] = (char)i + '@' + cVar2 * '\x05';
        }
        p_4 = p_4 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV422_YUYV) {
      p_5 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          cVar1 = (char)i;
          p_5[i << 2] = cVar1 * '\x02' + (char)local_40 + cVar2 * '\x03';
          p_5[i * 4 + 2] = cVar1 * '\x02' + '\x01' + (char)local_40 + cVar2 * '\x03';
          p_5[i * 4 + 1] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_5[i * 4 + 3] = cVar1 + '@' + cVar2 * '\x05';
        }
        p_5 = p_5 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV422_YVYU) {
      p_6 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          cVar1 = (char)i;
          p_6[i << 2] = cVar1 * '\x02' + (char)local_40 + cVar2 * '\x03';
          p_6[i * 4 + 2] = cVar1 * '\x02' + '\x01' + (char)local_40 + cVar2 * '\x03';
          p_6[i * 4 + 3] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_6[i * 4 + 1] = cVar1 + '@' + cVar2 * '\x05';
        }
        p_6 = p_6 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV422_UYVY) {
      p_7 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          cVar1 = (char)i;
          p_7[i * 4 + 1] = cVar1 * '\x02' + (char)local_40 + cVar2 * '\x03';
          p_7[i * 4 + 3] = cVar1 * '\x02' + '\x01' + (char)local_40 + cVar2 * '\x03';
          p_7[i << 2] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_7[i * 4 + 2] = cVar1 + '@' + cVar2 * '\x05';
        }
        p_7 = p_7 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV422_VYUY) {
      p_8 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width >> 1; i = i + 1) {
          cVar1 = (char)i;
          p_8[i * 4 + 1] = cVar1 * '\x02' + (char)local_40 + cVar2 * '\x03';
          p_8[i * 4 + 3] = cVar1 * '\x02' + '\x01' + (char)local_40 + cVar2 * '\x03';
          p_8[i * 4 + 2] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_8[i << 2] = cVar1 + '@' + cVar2 * '\x05';
        }
        p_8 = p_8 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV400) {
      p_9 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_9[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_9 = p_9 + hor_stride;
      }
    }
    else if (MVar3 == MPP_FMT_YUV444SP) {
      p_10 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_10[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_10 = p_10 + hor_stride;
      }
      p_10 = buf + hor_stride * ver_stride;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_10[i << 1] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
          p_10[i * 2 + 1] = (char)i + '@' + cVar2 * '\x05';
        }
        p_10 = p_10 + (hor_stride << 1);
      }
    }
    else if (MVar3 == MPP_FMT_YUV444P) {
      p_11 = buf;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_11[i] = (char)i + (char)local_40 + cVar2 * '\x03';
        }
        p_11 = p_11 + hor_stride;
      }
      p_11 = buf + hor_stride * ver_stride;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_11[i] = (char)(local_40 >> 1) + -0x80 + (char)(frame_count << 1);
        }
        p_11 = p_11 + hor_stride;
      }
      p_11 = buf + hor_stride * ver_stride * 2;
      for (local_40 = 0; local_40 < height; local_40 = local_40 + 1) {
        for (i = 0; i < width; i = i + 1) {
          p_11[i] = (char)i + '@' + cVar2 * '\x05';
        }
        p_11 = p_11 + hor_stride;
      }
    }
    else if (MVar3 - MPP_FMT_RGB565 < 6) {
      fill._4_4_ = 2;
      _G = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      pRStack_a8 = buf;
      RVar4 = util_check_stride_by_pixel(fill_image::is_pixel_stride,width,hor_stride,2);
      if (RVar4 != 0) {
        fmt_local = fill._4_4_ * fmt_local;
        fill_image::is_pixel_stride = 1;
      }
      RVar4 = util_check_8_pixel_aligned(fill_image::not_8_pixel,fmt_local,8,fill._4_4_,"16bit RGB")
      ;
      if (RVar4 != 0) {
        fmt_local = fmt_local + MPP_FMT_YUV444SP & ~MPP_FMT_YUV444SP;
        fill_image::not_8_pixel = 1;
      }
      for (local_40 = 0; local_40 < ver_stride_local; local_40 = local_40 + 1) {
        p._4_4_ = 0;
        for (i = 0; i < hor_stride_local; i = i + 1) {
          get_rgb_color(&B,&local_c0,(RK_U32 *)((long)&p_12 + 4),i,local_40,frame_count);
          (*_G)(pRStack_a8 + p._4_4_,B,local_c0,p_12._4_4_,
                SUB14((buf_y._4_4_ & 0x1000000) == MPP_FMT_YUV420SP,0));
          p._4_4_ = fill._4_4_ + p._4_4_;
        }
        pRStack_a8 = pRStack_a8 + fmt_local;
      }
    }
    else if (MVar3 - MPP_FMT_RGB888 < 2) {
      fill_2._4_4_ = 3;
      _G_2 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      pRStack_f8 = buf;
      RVar4 = util_check_stride_by_pixel(fill_image::is_pixel_stride,width,hor_stride,3);
      if (RVar4 != 0) {
        fmt_local = fill_2._4_4_ * fmt_local;
        fill_image::is_pixel_stride = 1;
      }
      RVar4 = util_check_8_pixel_aligned
                        (fill_image::not_8_pixel,fmt_local,8,fill_2._4_4_,"24bit RGB");
      if (RVar4 != 0) {
        fmt_local = ((fmt_local + (MPP_FMT_YUV_BUTT|MPP_FMT_YUV422SP_10BIT)) / 0x18) * 0x18;
        fill_image::not_8_pixel = 1;
      }
      for (local_40 = 0; local_40 < ver_stride_local; local_40 = local_40 + 1) {
        p._4_4_ = 0;
        for (i = 0; i < hor_stride_local; i = i + 1) {
          get_rgb_color(&B_2,&local_110,&local_114,i,local_40,frame_count);
          (*_G_2)(pRStack_f8 + p._4_4_,B_2,local_110,local_114,
                  SUB14((buf_y._4_4_ & 0x1000000) == MPP_FMT_YUV420SP,0));
          p._4_4_ = fill_2._4_4_ + p._4_4_;
        }
        pRStack_f8 = pRStack_f8 + fmt_local;
      }
    }
    else if (MVar3 - MPP_FMT_RGB101010 < 6) {
      fill_1._4_4_ = 4;
      _G_1 = fill_rgb_funcs[fmt - MPP_FMT_RGB565];
      pRStack_d0 = buf;
      RVar4 = util_check_stride_by_pixel(fill_image::is_pixel_stride,width,hor_stride,4);
      if (RVar4 != 0) {
        fmt_local = fill_1._4_4_ * fmt_local;
        fill_image::is_pixel_stride = 1;
      }
      RVar4 = util_check_8_pixel_aligned
                        (fill_image::not_8_pixel,fmt_local,8,fill_1._4_4_,"32bit RGB");
      if (RVar4 != 0) {
        fmt_local = fmt_local + (MPP_FMT_YUV444P|MPP_FMT_YUV444SP) &
                    ~(MPP_FMT_YUV444P|MPP_FMT_YUV444SP);
        fill_image::not_8_pixel = 1;
      }
      for (local_40 = 0; local_40 < ver_stride_local; local_40 = local_40 + 1) {
        p._4_4_ = 0;
        for (i = 0; i < hor_stride_local; i = i + 1) {
          get_rgb_color(&B_1,&local_e8,(RK_U32 *)((long)&p_13 + 4),i,local_40,frame_count);
          (*_G_1)(pRStack_d0 + p._4_4_,B_1,local_e8,p_13._4_4_,
                  SUB14((buf_y._4_4_ & 0x1000000) == MPP_FMT_YUV420SP,0));
          p._4_4_ = fill_1._4_4_ + p._4_4_;
        }
        pRStack_d0 = pRStack_d0 + fmt_local;
      }
    }
    else {
      _mpp_log_l(2,"utils","filling function do not support type %d\n","fill_image",fmt);
      buf_y._0_4_ = MPP_NOK;
    }
  }
  return (MPP_RET)buf_y;
}

Assistant:

MPP_RET fill_image(RK_U8 *buf, RK_U32 width, RK_U32 height,
                   RK_U32 hor_stride, RK_U32 ver_stride, MppFrameFormat fmt,
                   RK_U32 frame_count)
{
    MPP_RET ret = MPP_OK;
    RK_U8 *buf_y = buf;
    RK_U8 *buf_c = buf + hor_stride * ver_stride;
    RK_U32 x, y, i;
    static RK_S32 is_pixel_stride = 0;
    static RK_S32 not_8_pixel = 0;

    switch (fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP : {
        fill_MPP_FMT_YUV420SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV422SP : {
        fill_MPP_FMT_YUV422SP(buf, width, height, hor_stride, ver_stride, frame_count);
    } break;
    case MPP_FMT_YUV420P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 4;
        for (y = 0; y < height / 2; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV420SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height / 2; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }

        p = buf_c + hor_stride * ver_stride / 2;
        for (y = 0; y < height; y++, p += hor_stride / 2) {
            for (x = 0; x < width / 2; x++) {
                p[x] = 64 + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422SP_VU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf_c;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 2 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YUYV : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 1] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 3] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_YVYU : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 0] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 2] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 3] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_UYVY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 2] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV422_VYUY : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width / 2; x++) {
                p[x * 4 + 1] = x * 2 + 0 + y + frame_count * 3;
                p[x * 4 + 3] = x * 2 + 1 + y + frame_count * 3;
                p[x * 4 + 2] = 128 + y / 2 + frame_count * 2;
                p[x * 4 + 0] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV400 : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
    } break;
    case MPP_FMT_YUV444SP : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }

        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride * 2) {
            for (x = 0; x < width; x++) {
                p[x * 2 + 0] = 128 + y / 2 + frame_count * 2;
                p[x * 2 + 1] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_YUV444P : {
        RK_U8 *p = buf_y;

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = x + y + frame_count * 3;
            }
        }
        p = buf + hor_stride * ver_stride;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 128 + y / 2 + frame_count * 2;
            }
        }
        p = buf + hor_stride * ver_stride * 2;
        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0; x < width; x++) {
                p[x] = 64  + x + frame_count * 5;
            }
        }
    } break;
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 2;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "16bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 16);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 4;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "32bit RGB")) {
            hor_stride = MPP_ALIGN(hor_stride, 32);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB888 : {
        RK_U8 *p = buf_y;
        RK_U32 pix_w = 3;
        FillRgbFunc fill = fill_rgb_funcs[fmt - MPP_FRAME_FMT_RGB];

        if (util_check_stride_by_pixel(is_pixel_stride, width, hor_stride, pix_w)) {
            hor_stride *= pix_w;
            is_pixel_stride = 1;
        }

        if (util_check_8_pixel_aligned(not_8_pixel, hor_stride,
                                       8, pix_w, "24bit RGB")) {
            hor_stride = MPP_ALIGN_GEN(hor_stride, 24);
            not_8_pixel = 1;
        }

        for (y = 0; y < height; y++, p += hor_stride) {
            for (x = 0, i = 0; x < width; x++, i += pix_w) {
                RK_U32 R, G, B;

                get_rgb_color(&R, &G, &B, x, y, frame_count);
                fill(p + i, R, G, B, MPP_FRAME_FMT_IS_BE(fmt));
            }
        }
    } break;
    default : {
        mpp_err_f("filling function do not support type %d\n", fmt);
        ret = MPP_NOK;
    } break;
    }
    return ret;
}